

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O3

void InsertText(char *upto,char *c,
               vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               *result)

{
  pointer *ppcVar1;
  iterator __position;
  cmGeneratorExpressionToken local_18;
  
  if (upto != c) {
    local_18.Length = (long)c - (long)upto;
    local_18.TokenType = 0;
    __position._M_current =
         (result->
         super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (result->
        super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_18.Content = upto;
      std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
      _M_realloc_insert<cmGeneratorExpressionToken>(result,__position,&local_18);
    }
    else {
      (__position._M_current)->Length = local_18.Length;
      *(ulong *)__position._M_current = (ulong)(uint)local_18._4_4_ << 0x20;
      (__position._M_current)->Content = upto;
      ppcVar1 = &(result->
                 super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return;
}

Assistant:

static void InsertText(const char* upto, const char* c,
                       std::vector<cmGeneratorExpressionToken>& result)
{
  if (upto != c) {
    result.push_back(cmGeneratorExpressionToken(
      cmGeneratorExpressionToken::Text, upto, c - upto));
  }
}